

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  vfloat<4> vVar2;
  undefined4 uVar3;
  BVH *bvh;
  size_t sVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  byte bVar60;
  bool bVar61;
  int iVar62;
  AABBNodeMB4D *node1;
  ulong uVar63;
  ulong uVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  QuadMesh *mesh;
  NodeRef *pNVar68;
  size_t sVar69;
  long lVar70;
  ulong uVar71;
  vuint<4> *v;
  long lVar72;
  uint uVar73;
  byte bVar74;
  byte bVar75;
  undefined4 uVar76;
  uint uVar77;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar78;
  ulong uVar79;
  ulong uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  vfloat_impl<4> vVar113;
  vfloat_impl<4> vVar114;
  vfloat_impl<4> vVar115;
  vfloat_impl<4> vVar116;
  vfloat_impl<4> vVar117;
  vfloat_impl<4> vVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  float fVar129;
  float fVar130;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  undefined1 auVar128 [16];
  vint4 ai_2;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  vint4 ai_1;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 in_ZMM2 [64];
  float fVar137;
  float fVar145;
  float fVar146;
  vint4 ai_3;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar147;
  float fVar148;
  float fVar156;
  float fVar157;
  vint4 bi;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar158;
  vint4 bi_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  vint4 bi_3;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar168;
  float fVar171;
  float fVar172;
  vint4 bi_2;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar177;
  float fVar181;
  float fVar182;
  vint4 ai;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  uint local_1a24;
  Vec3<embree::vfloat_impl<4>_> p1;
  Precalculations pre;
  undefined1 local_1968 [16];
  RayK<4> *local_1958;
  undefined4 local_194c;
  Vec3<embree::vfloat_impl<4>_> p0;
  vint<4> itime;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  undefined1 local_1818 [8];
  float fStack_1810;
  float fStack_180c;
  undefined1 local_1808 [8];
  float fStack_1800;
  float fStack_17fc;
  undefined1 local_17f8 [8];
  float fStack_17f0;
  float fStack_17ec;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar81 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar85 = ZEXT816(0) << 0x40;
    uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar85,5);
    uVar79 = vpcmpeqd_avx512vl(auVar81,(undefined1  [16])valid_i->field_0);
    uVar79 = ((byte)uVar10 & 0xf) & uVar79;
    bVar60 = (byte)uVar79;
    if (bVar60 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar189 = ZEXT1664(auVar81);
      auVar82 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar81);
      auVar86._8_4_ = 0x219392ef;
      auVar86._0_8_ = 0x219392ef219392ef;
      auVar86._12_4_ = 0x219392ef;
      uVar80 = vcmpps_avx512vl(auVar82,auVar86,1);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar190 = ZEXT1664(auVar82);
      auVar83 = vdivps_avx512vl(auVar82,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar84 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar81);
      uVar64 = vcmpps_avx512vl(auVar84,auVar86,1);
      auVar84 = vdivps_avx512vl(auVar82,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar81 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar81);
      uVar63 = vcmpps_avx512vl(auVar81,auVar86,1);
      auVar81 = vdivps_avx512vl(auVar82,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar61 = (bool)((byte)uVar80 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar83._0_4_;
      bVar61 = (bool)((byte)(uVar80 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar83._4_4_;
      bVar61 = (bool)((byte)(uVar80 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar83._8_4_;
      bVar61 = (bool)((byte)(uVar80 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar83._12_4_;
      bVar61 = (bool)((byte)uVar64 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar84._0_4_;
      bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar84._4_4_;
      bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar84._8_4_;
      bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar84._12_4_;
      bVar61 = (bool)((byte)uVar63 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar81._0_4_;
      bVar61 = (bool)((byte)(uVar63 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar81._4_4_;
      bVar61 = (bool)((byte)(uVar63 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar81._8_4_;
      bVar61 = (bool)((byte)(uVar63 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar81._12_4_;
      uVar80 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar85,1);
      auVar81 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar80 & 1) * auVar81._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar80 >> 1) & 1) * auVar81._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar80 >> 2) & 1) * auVar81._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar80 >> 3) & 1) * auVar81._12_4_;
      uVar80 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar85,5);
      auVar81 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar61 = (bool)((byte)uVar80 & 1);
      bVar7 = (bool)((byte)(uVar80 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar80 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar80 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar61 * auVar81._0_4_ | (uint)!bVar61 * 0x30;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar7 * auVar81._4_4_ | (uint)!bVar7 * 0x30;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar8 * auVar81._8_4_ | (uint)!bVar8 * 0x30;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar9 * auVar81._12_4_ | (uint)!bVar9 * 0x30;
      local_194c = (undefined4)uVar79;
      uVar80 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar85,5);
      auVar81 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar61 = (bool)((byte)uVar80 & 1);
      bVar7 = (bool)((byte)(uVar80 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar80 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar80 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar61 * auVar81._0_4_ | (uint)!bVar61 * 0x50;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar7 * auVar81._4_4_ | (uint)!bVar7 * 0x50;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar8 * auVar81._8_4_ | (uint)!bVar8 * 0x50;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar9 * auVar81._12_4_ | (uint)!bVar9 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar191 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar81 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar85);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar60 & 1) * auVar81._0_4_ |
           (uint)!(bool)(bVar60 & 1) * stack_near[0].field_0._0_4_;
      bVar61 = (bool)((byte)(uVar79 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar61 * auVar81._4_4_ | (uint)!bVar61 * stack_near[0].field_0._4_4_;
      bVar61 = (bool)((byte)(uVar79 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar61 * auVar81._8_4_ | (uint)!bVar61 * stack_near[0].field_0._8_4_;
      bVar61 = SUB81(uVar79 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar61 * auVar81._12_4_ | (uint)!bVar61 * stack_near[0].field_0._12_4_;
      auVar81 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar85);
      tray.tfar.field_0.i[0] =
           (uint)(bVar60 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar60 & 1) * -0x800000;
      bVar61 = (bool)((byte)(uVar79 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar61 * auVar81._4_4_ | (uint)!bVar61 * -0x800000;
      bVar61 = (bool)((byte)(uVar79 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar61 * auVar81._8_4_ | (uint)!bVar61 * -0x800000;
      bVar61 = SUB81(uVar79 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar61 * auVar81._12_4_ | (uint)!bVar61 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar73 = 3;
      }
      else {
        uVar73 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1958 = ray + 0x80;
      local_1a24 = (ushort)uVar79 ^ 0xf;
      pNVar68 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar78 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar192 = ZEXT1664(auVar81);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar193 = ZEXT1664(auVar81);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar188 = ZEXT1664(auVar81);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar187 = ZEXT1664(auVar81);
LAB_01c99ae1:
      do {
        do {
          root.ptr = pNVar68[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c9b453;
          pNVar68 = pNVar68 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar78[-1].v;
          auVar184 = ZEXT1664((undefined1  [16])vVar2.field_0);
          paVar78 = paVar78 + -1;
          uVar79 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar79 == '\0');
        uVar76 = (undefined4)uVar79;
        if (uVar73 < (uint)POPCOUNT(uVar76)) {
LAB_01c99b29:
          do {
            lVar65 = -0x10;
            uVar77 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c9b453;
              uVar10 = vcmpps_avx512vl(auVar184._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar10 == '\0') goto LAB_01c99ae1;
              bVar60 = ~(byte)local_1a24 & 0xf;
              lVar65 = 0;
              goto LAB_01c99d84;
            }
            uVar10 = vcmpps_avx512vl(auVar184._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar79 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            aVar124 = auVar191._0_16_;
            for (; (auVar184 = ZEXT1664((undefined1  [16])aVar124), lVar65 != 0 &&
                   (sVar4 = *(size_t *)(uVar79 + 0x20 + lVar65 * 2), sVar4 != 8));
                lVar65 = lVar65 + 4) {
              uVar76 = *(undefined4 *)(uVar79 + 0x90 + lVar65);
              auVar132._4_4_ = uVar76;
              auVar132._0_4_ = uVar76;
              auVar132._8_4_ = uVar76;
              auVar132._12_4_ = uVar76;
              auVar81 = *(undefined1 (*) [16])(ray + 0x70);
              uVar76 = *(undefined4 *)(uVar79 + 0x30 + lVar65);
              auVar13._4_4_ = uVar76;
              auVar13._0_4_ = uVar76;
              auVar13._8_4_ = uVar76;
              auVar13._12_4_ = uVar76;
              auVar85 = vfmadd213ps_avx512vl(auVar132,auVar81,auVar13);
              uVar76 = *(undefined4 *)(uVar79 + 0xb0 + lVar65);
              auVar134._4_4_ = uVar76;
              auVar134._0_4_ = uVar76;
              auVar134._8_4_ = uVar76;
              auVar134._12_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar79 + 0x50 + lVar65);
              auVar14._4_4_ = uVar76;
              auVar14._0_4_ = uVar76;
              auVar14._8_4_ = uVar76;
              auVar14._12_4_ = uVar76;
              auVar82 = vfmadd213ps_avx512vl(auVar134,auVar81,auVar14);
              uVar76 = *(undefined4 *)(uVar79 + 0xd0 + lVar65);
              auVar138._4_4_ = uVar76;
              auVar138._0_4_ = uVar76;
              auVar138._8_4_ = uVar76;
              auVar138._12_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar79 + 0x70 + lVar65);
              auVar15._4_4_ = uVar76;
              auVar15._0_4_ = uVar76;
              auVar15._8_4_ = uVar76;
              auVar15._12_4_ = uVar76;
              auVar83 = vfmadd213ps_avx512vl(auVar138,auVar81,auVar15);
              uVar76 = *(undefined4 *)(uVar79 + 0xa0 + lVar65);
              auVar149._4_4_ = uVar76;
              auVar149._0_4_ = uVar76;
              auVar149._8_4_ = uVar76;
              auVar149._12_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar79 + 0x40 + lVar65);
              auVar16._4_4_ = uVar76;
              auVar16._0_4_ = uVar76;
              auVar16._8_4_ = uVar76;
              auVar16._12_4_ = uVar76;
              auVar84 = vfmadd213ps_avx512vl(auVar149,auVar81,auVar16);
              uVar76 = *(undefined4 *)(uVar79 + 0xc0 + lVar65);
              auVar159._4_4_ = uVar76;
              auVar159._0_4_ = uVar76;
              auVar159._8_4_ = uVar76;
              auVar159._12_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar79 + 0x60 + lVar65);
              auVar17._4_4_ = uVar76;
              auVar17._0_4_ = uVar76;
              auVar17._8_4_ = uVar76;
              auVar17._12_4_ = uVar76;
              auVar86 = vfmadd213ps_avx512vl(auVar159,auVar81,auVar17);
              uVar76 = *(undefined4 *)(uVar79 + 0xe0 + lVar65);
              auVar163._4_4_ = uVar76;
              auVar163._0_4_ = uVar76;
              auVar163._8_4_ = uVar76;
              auVar163._12_4_ = uVar76;
              uVar76 = *(undefined4 *)(uVar79 + 0x80 + lVar65);
              auVar18._4_4_ = uVar76;
              auVar18._0_4_ = uVar76;
              auVar18._8_4_ = uVar76;
              auVar18._12_4_ = uVar76;
              auVar87 = vfmadd213ps_avx512vl(auVar163,auVar81,auVar18);
              auVar31._8_8_ = tray.org.field_0._8_8_;
              auVar31._0_8_ = tray.org.field_0._0_8_;
              auVar32._8_8_ = tray.org.field_0._24_8_;
              auVar32._0_8_ = tray.org.field_0._16_8_;
              auVar33._8_8_ = tray.org.field_0._40_8_;
              auVar33._0_8_ = tray.org.field_0._32_8_;
              auVar85 = vsubps_avx(auVar85,auVar31);
              auVar178._0_4_ = tray.rdir.field_0._0_4_ * auVar85._0_4_;
              auVar178._4_4_ = tray.rdir.field_0._4_4_ * auVar85._4_4_;
              auVar178._8_4_ = tray.rdir.field_0._8_4_ * auVar85._8_4_;
              auVar178._12_4_ = tray.rdir.field_0._12_4_ * auVar85._12_4_;
              auVar85 = vsubps_avx(auVar82,auVar32);
              auVar135._0_4_ = auVar85._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar135._4_4_ = auVar85._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar135._8_4_ = auVar85._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar135._12_4_ = auVar85._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar85 = vsubps_avx(auVar83,auVar33);
              auVar139._0_4_ = tray.rdir.field_0._32_4_ * auVar85._0_4_;
              auVar139._4_4_ = tray.rdir.field_0._36_4_ * auVar85._4_4_;
              auVar139._8_4_ = tray.rdir.field_0._40_4_ * auVar85._8_4_;
              auVar139._12_4_ = tray.rdir.field_0._44_4_ * auVar85._12_4_;
              auVar85 = vsubps_avx(auVar84,auVar31);
              auVar150._0_4_ = tray.rdir.field_0._0_4_ * auVar85._0_4_;
              auVar150._4_4_ = tray.rdir.field_0._4_4_ * auVar85._4_4_;
              auVar150._8_4_ = tray.rdir.field_0._8_4_ * auVar85._8_4_;
              auVar150._12_4_ = tray.rdir.field_0._12_4_ * auVar85._12_4_;
              auVar85 = vsubps_avx(auVar86,auVar32);
              auVar160._0_4_ = auVar85._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar160._4_4_ = auVar85._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar160._8_4_ = auVar85._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar160._12_4_ = auVar85._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar85 = vsubps_avx(auVar87,auVar33);
              auVar164._0_4_ = tray.rdir.field_0._32_4_ * auVar85._0_4_;
              auVar164._4_4_ = tray.rdir.field_0._36_4_ * auVar85._4_4_;
              auVar164._8_4_ = tray.rdir.field_0._40_4_ * auVar85._8_4_;
              auVar164._12_4_ = tray.rdir.field_0._44_4_ * auVar85._12_4_;
              auVar85 = vpminsd_avx(auVar178,auVar150);
              auVar82 = vpminsd_avx(auVar135,auVar160);
              auVar85 = vpmaxsd_avx(auVar85,auVar82);
              auVar82 = vpminsd_avx(auVar139,auVar164);
              auVar85 = vpmaxsd_avx(auVar85,auVar82);
              auVar83 = vmulps_avx512vl(auVar85,auVar192._0_16_);
              auVar85 = vpmaxsd_avx(auVar178,auVar150);
              auVar82 = vpmaxsd_avx(auVar135,auVar160);
              auVar82 = vpminsd_avx(auVar85,auVar82);
              auVar85 = vpmaxsd_avx(auVar139,auVar164);
              auVar85 = vpminsd_avx(auVar82,auVar85);
              auVar82 = vmulps_avx512vl(auVar85,auVar193._0_16_);
              auVar85 = vpmaxsd_avx(auVar83,(undefined1  [16])tray.tnear.field_0);
              auVar82 = vpminsd_avx(auVar82,(undefined1  [16])tray.tfar.field_0);
              uVar11 = vcmpps_avx512vl(auVar85,auVar82,2);
              bVar60 = (byte)uVar11;
              if ((uVar77 & 7) == 6) {
                uVar76 = *(undefined4 *)(uVar79 + 0x100 + lVar65);
                auVar19._4_4_ = uVar76;
                auVar19._0_4_ = uVar76;
                auVar19._8_4_ = uVar76;
                auVar19._12_4_ = uVar76;
                uVar11 = vcmpps_avx512vl(auVar81,auVar19,1);
                uVar76 = *(undefined4 *)(uVar79 + 0xf0 + lVar65);
                auVar20._4_4_ = uVar76;
                auVar20._0_4_ = uVar76;
                auVar20._8_4_ = uVar76;
                auVar20._12_4_ = uVar76;
                uVar12 = vcmpps_avx512vl(auVar81,auVar20,0xd);
                bVar60 = (byte)uVar11 & (byte)uVar12 & bVar60;
              }
              bVar60 = bVar60 & (byte)uVar10;
              sVar69 = root.ptr;
              aVar88 = aVar124;
              if (bVar60 != 0) {
                auVar85 = vblendmps_avx512vl((undefined1  [16])auVar191._0_16_,auVar83);
                aVar88._0_4_ = (uint)(bVar60 & 1) * auVar85._0_4_ |
                               (uint)!(bool)(bVar60 & 1) * auVar81._0_4_;
                bVar61 = (bool)(bVar60 >> 1 & 1);
                aVar88._4_4_ = (uint)bVar61 * auVar85._4_4_ | (uint)!bVar61 * auVar81._4_4_;
                bVar61 = (bool)(bVar60 >> 2 & 1);
                aVar88._8_4_ = (uint)bVar61 * auVar85._8_4_ | (uint)!bVar61 * auVar81._8_4_;
                bVar61 = (bool)(bVar60 >> 3 & 1);
                aVar88._12_4_ = (uint)bVar61 * auVar85._12_4_ | (uint)!bVar61 * auVar81._12_4_;
                sVar69 = sVar4;
                if (root.ptr != 8) {
                  pNVar68->ptr = root.ptr;
                  pNVar68 = pNVar68 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar78->v = aVar124;
                  paVar78 = paVar78 + 1;
                }
              }
              aVar124 = aVar88;
              root.ptr = sVar69;
            }
            if (root.ptr == 8) goto LAB_01c99d31;
            uVar10 = vcmpps_avx512vl((undefined1  [16])aVar124,(undefined1  [16])tray.tfar.field_0,9
                                    );
          } while ((byte)uVar73 < (byte)POPCOUNT((int)uVar10));
          pNVar68->ptr = root.ptr;
          pNVar68 = pNVar68 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar78->v = aVar124;
          paVar78 = paVar78 + 1;
LAB_01c99d31:
          iVar62 = 4;
        }
        else {
          while (uVar79 != 0) {
            sVar4 = 0;
            for (uVar80 = uVar79; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
              sVar4 = sVar4 + 1;
            }
            uVar79 = uVar79 - 1 & uVar79;
            bVar61 = occluded1(This,bvh,root,sVar4,&pre,ray,&tray,context);
            bVar60 = (byte)(1 << ((uint)sVar4 & 0x1f));
            if (!bVar61) {
              bVar60 = 0;
            }
            local_1a24 = (uint)((byte)local_1a24 | bVar60);
          }
          iVar62 = 3;
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar189 = ZEXT1664(auVar81);
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar190 = ZEXT1664(auVar81);
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar191 = ZEXT1664(auVar81);
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar192 = ZEXT1664(auVar81);
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar193 = ZEXT1664(auVar81);
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar188 = ZEXT1664(auVar81);
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar187 = ZEXT1664(auVar81);
          auVar184 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((byte)local_1a24 != 0xf) {
            auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_1a24 & 1) * auVar81._0_4_ |
                 (uint)!(bool)((byte)local_1a24 & 1) * tray.tfar.field_0.i[0];
            bVar61 = (bool)((byte)(local_1a24 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar61 * auVar81._4_4_ | (uint)!bVar61 * tray.tfar.field_0.i[1];
            bVar61 = (bool)((byte)(local_1a24 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar61 * auVar81._8_4_ | (uint)!bVar61 * tray.tfar.field_0.i[2];
            bVar61 = (bool)((byte)(local_1a24 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar61 * auVar81._12_4_ | (uint)!bVar61 * tray.tfar.field_0.i[3];
            iVar62 = 2;
          }
          if (uVar73 < (uint)POPCOUNT(uVar76)) goto LAB_01c99b29;
        }
      } while (iVar62 != 3);
LAB_01c9b453:
      local_1a24._0_1_ = (byte)local_1a24 & (byte)local_194c;
      bVar61 = (bool)((byte)local_1a24 >> 1 & 1);
      bVar7 = (bool)((byte)local_1a24 >> 2 & 1);
      bVar8 = (bool)((byte)local_1a24 >> 3 & 1);
      *(uint *)local_1958 =
           (uint)((byte)local_1a24 & 1) * -0x800000 |
           (uint)!(bool)((byte)local_1a24 & 1) * *(int *)local_1958;
      *(uint *)(local_1958 + 4) =
           (uint)bVar61 * -0x800000 | (uint)!bVar61 * *(int *)(local_1958 + 4);
      *(uint *)(local_1958 + 8) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_1958 + 8);
      *(uint *)(local_1958 + 0xc) =
           (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_1958 + 0xc);
    }
  }
  return;
LAB_01c99d84:
  do {
    if (lVar65 == (ulong)(uVar77 & 0xf) - 8) goto LAB_01c9b2f6;
    lVar70 = lVar65 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    uVar79 = 0;
    uVar64 = (ulong)bVar60;
    for (uVar80 = uVar64; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      uVar79 = uVar79 + 1;
    }
    lVar72 = 0;
    bVar75 = bVar60;
    do {
      if ((lVar72 == 4) || (*(int *)(lVar70 + 0x50 + lVar72 * 4) == -1)) goto LAB_01c9b2db;
      pGVar5 = (context->scene->geometries).items[*(uint *)(lVar70 + 0x40 + lVar72 * 4)].ptr;
      fVar123 = (pGVar5->time_range).lower;
      auVar81._4_4_ = fVar123;
      auVar81._0_4_ = fVar123;
      auVar81._8_4_ = fVar123;
      auVar81._12_4_ = fVar123;
      fVar129 = pGVar5->fnumTimeSegments;
      auVar83._4_4_ = fVar129;
      auVar83._0_4_ = fVar129;
      auVar83._8_4_ = fVar129;
      auVar83._12_4_ = fVar129;
      auVar81 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar81);
      fVar123 = (pGVar5->time_range).upper - fVar123;
      auVar85._4_4_ = fVar123;
      auVar85._0_4_ = fVar123;
      auVar85._8_4_ = fVar123;
      auVar85._12_4_ = fVar123;
      auVar81 = vdivps_avx(auVar81,auVar85);
      auVar82._0_4_ = fVar129 * auVar81._0_4_;
      auVar82._4_4_ = fVar129 * auVar81._4_4_;
      auVar82._8_4_ = fVar129 * auVar81._8_4_;
      auVar82._12_4_ = fVar129 * auVar81._12_4_;
      auVar81 = vroundps_avx(auVar82,1);
      auVar85 = vaddss_avx512f(auVar83,SUB6416(ZEXT464(0xbf800000),0));
      auVar84._0_4_ = auVar85._0_4_;
      auVar84._4_4_ = auVar84._0_4_;
      auVar84._8_4_ = auVar84._0_4_;
      auVar84._12_4_ = auVar84._0_4_;
      auVar81 = vminps_avx(auVar81,auVar84);
      auVar81 = vmaxps_avx(auVar81,_DAT_01f45a50);
      itime.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar81);
      auVar81 = vsubps_avx(auVar82,auVar81);
      auVar85 = vpbroadcastd_avx512vl();
      uVar10 = vpcmpeqd_avx512vl(auVar85,(undefined1  [16])itime.field_0);
      auVar85 = auVar190._0_16_;
      uVar63 = uVar64;
      uVar80 = uVar79;
      if ((byte)((byte)uVar10 & 0xf | bVar60 ^ 0xf) == 0xf) {
        lVar66 = (long)itime.field_0.i[uVar79] * 0x38;
        lVar67 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar66);
        lVar66 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar66);
        uVar80 = (ulong)*(uint *)(lVar70 + lVar72 * 4);
        uVar63 = (ulong)*(uint *)(lVar70 + 0x10 + lVar72 * 4);
        auVar82 = vsubps_avx512vl(auVar85,auVar81);
        uVar76 = *(undefined4 *)(lVar66 + uVar80 * 4);
        auVar109._4_4_ = uVar76;
        auVar109._0_4_ = uVar76;
        auVar109._8_4_ = uVar76;
        auVar109._12_4_ = uVar76;
        auVar83 = vmulps_avx512vl(auVar81,auVar109);
        uVar76 = *(undefined4 *)(lVar66 + 4 + uVar80 * 4);
        auVar110._4_4_ = uVar76;
        auVar110._0_4_ = uVar76;
        auVar110._8_4_ = uVar76;
        auVar110._12_4_ = uVar76;
        auVar84 = vmulps_avx512vl(auVar81,auVar110);
        uVar76 = *(undefined4 *)(lVar66 + 8 + uVar80 * 4);
        auVar96._4_4_ = uVar76;
        auVar96._0_4_ = uVar76;
        auVar96._8_4_ = uVar76;
        auVar96._12_4_ = uVar76;
        auVar86 = vmulps_avx512vl(auVar81,auVar96);
        uVar76 = *(undefined4 *)(lVar67 + uVar80 * 4);
        auVar97._4_4_ = uVar76;
        auVar97._0_4_ = uVar76;
        auVar97._8_4_ = uVar76;
        auVar97._12_4_ = uVar76;
        auVar89 = vfmadd231ps_avx512vl(auVar83,auVar82,auVar97);
        uVar76 = *(undefined4 *)(lVar67 + 4 + uVar80 * 4);
        auVar98._4_4_ = uVar76;
        auVar98._0_4_ = uVar76;
        auVar98._8_4_ = uVar76;
        auVar98._12_4_ = uVar76;
        auVar87 = vfmadd231ps_avx512vl(auVar84,auVar82,auVar98);
        uVar76 = *(undefined4 *)(lVar67 + 8 + uVar80 * 4);
        auVar99._4_4_ = uVar76;
        auVar99._0_4_ = uVar76;
        auVar99._8_4_ = uVar76;
        auVar99._12_4_ = uVar76;
        auVar90 = vfmadd231ps_avx512vl(auVar86,auVar82,auVar99);
        uVar76 = *(undefined4 *)(lVar66 + uVar63 * 4);
        auVar100._4_4_ = uVar76;
        auVar100._0_4_ = uVar76;
        auVar100._8_4_ = uVar76;
        auVar100._12_4_ = uVar76;
        auVar83 = vmulps_avx512vl(auVar81,auVar100);
        uVar76 = *(undefined4 *)(lVar66 + 4 + uVar63 * 4);
        auVar101._4_4_ = uVar76;
        auVar101._0_4_ = uVar76;
        auVar101._8_4_ = uVar76;
        auVar101._12_4_ = uVar76;
        auVar84 = vmulps_avx512vl(auVar81,auVar101);
        uVar76 = *(undefined4 *)(lVar66 + 8 + uVar63 * 4);
        auVar102._4_4_ = uVar76;
        auVar102._0_4_ = uVar76;
        auVar102._8_4_ = uVar76;
        auVar102._12_4_ = uVar76;
        auVar86 = vmulps_avx512vl(auVar81,auVar102);
        uVar76 = *(undefined4 *)(lVar67 + uVar63 * 4);
        auVar103._4_4_ = uVar76;
        auVar103._0_4_ = uVar76;
        auVar103._8_4_ = uVar76;
        auVar103._12_4_ = uVar76;
        auVar91 = vfmadd231ps_avx512vl(auVar83,auVar82,auVar103);
        uVar76 = *(undefined4 *)(lVar67 + 4 + uVar63 * 4);
        auVar104._4_4_ = uVar76;
        auVar104._0_4_ = uVar76;
        auVar104._8_4_ = uVar76;
        auVar104._12_4_ = uVar76;
        auVar92 = vfmadd231ps_avx512vl(auVar84,auVar82,auVar104);
        uVar76 = *(undefined4 *)(lVar67 + 8 + uVar63 * 4);
        auVar105._4_4_ = uVar76;
        auVar105._0_4_ = uVar76;
        auVar105._8_4_ = uVar76;
        auVar105._12_4_ = uVar76;
        auVar93 = vfmadd231ps_avx512vl(auVar86,auVar82,auVar105);
        uVar80 = (ulong)*(uint *)(lVar70 + 0x20 + lVar72 * 4);
        uVar76 = *(undefined4 *)(lVar66 + uVar80 * 4);
        auVar106._4_4_ = uVar76;
        auVar106._0_4_ = uVar76;
        auVar106._8_4_ = uVar76;
        auVar106._12_4_ = uVar76;
        auVar83 = vmulps_avx512vl(auVar81,auVar106);
        uVar76 = *(undefined4 *)(lVar66 + 4 + uVar80 * 4);
        auVar107._4_4_ = uVar76;
        auVar107._0_4_ = uVar76;
        auVar107._8_4_ = uVar76;
        auVar107._12_4_ = uVar76;
        auVar84 = vmulps_avx512vl(auVar81,auVar107);
        uVar76 = *(undefined4 *)(lVar66 + 8 + uVar80 * 4);
        auVar108._4_4_ = uVar76;
        auVar108._0_4_ = uVar76;
        auVar108._8_4_ = uVar76;
        auVar108._12_4_ = uVar76;
        auVar86 = vmulps_avx512vl(auVar81,auVar108);
        uVar76 = *(undefined4 *)(lVar67 + uVar80 * 4);
        auVar112._4_4_ = uVar76;
        auVar112._0_4_ = uVar76;
        auVar112._8_4_ = uVar76;
        auVar112._12_4_ = uVar76;
        _local_1818 = vfmadd231ps_avx512vl(auVar83,auVar82,auVar112);
        uVar76 = *(undefined4 *)(lVar67 + 4 + uVar80 * 4);
        auVar21._4_4_ = uVar76;
        auVar21._0_4_ = uVar76;
        auVar21._8_4_ = uVar76;
        auVar21._12_4_ = uVar76;
        _local_17f8 = vfmadd231ps_avx512vl(auVar84,auVar82,auVar21);
        uVar76 = *(undefined4 *)(lVar67 + 8 + uVar80 * 4);
        auVar22._4_4_ = uVar76;
        auVar22._0_4_ = uVar76;
        auVar22._8_4_ = uVar76;
        auVar22._12_4_ = uVar76;
        _local_1808 = vfmadd231ps_avx512vl(auVar86,auVar82,auVar22);
        uVar80 = (ulong)*(uint *)(lVar70 + 0x30 + lVar72 * 4);
        uVar76 = *(undefined4 *)(lVar66 + uVar80 * 4);
        auVar23._4_4_ = uVar76;
        auVar23._0_4_ = uVar76;
        auVar23._8_4_ = uVar76;
        auVar23._12_4_ = uVar76;
        auVar83 = vmulps_avx512vl(auVar81,auVar23);
        uVar76 = *(undefined4 *)(lVar66 + 4 + uVar80 * 4);
        auVar24._4_4_ = uVar76;
        auVar24._0_4_ = uVar76;
        auVar24._8_4_ = uVar76;
        auVar24._12_4_ = uVar76;
        auVar84 = vmulps_avx512vl(auVar81,auVar24);
        uVar76 = *(undefined4 *)(lVar66 + 8 + uVar80 * 4);
        auVar25._4_4_ = uVar76;
        auVar25._0_4_ = uVar76;
        auVar25._8_4_ = uVar76;
        auVar25._12_4_ = uVar76;
        auVar81 = vmulps_avx512vl(auVar81,auVar25);
        uVar76 = *(undefined4 *)(lVar67 + uVar80 * 4);
        auVar26._4_4_ = uVar76;
        auVar26._0_4_ = uVar76;
        auVar26._8_4_ = uVar76;
        auVar26._12_4_ = uVar76;
        auVar94 = vfmadd231ps_avx512vl(auVar83,auVar82,auVar26);
        uVar76 = *(undefined4 *)(lVar67 + 4 + uVar80 * 4);
        auVar27._4_4_ = uVar76;
        auVar27._0_4_ = uVar76;
        auVar27._8_4_ = uVar76;
        auVar27._12_4_ = uVar76;
        auVar95 = vfmadd231ps_avx512vl(auVar84,auVar82,auVar27);
        uVar76 = *(undefined4 *)(lVar67 + 8 + uVar80 * 4);
        auVar28._4_4_ = uVar76;
        auVar28._0_4_ = uVar76;
        auVar28._8_4_ = uVar76;
        auVar28._12_4_ = uVar76;
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar82,auVar28);
      }
      else {
        while (uVar63 != 0) {
          lVar67 = (long)itime.field_0.i[uVar80] * 0x38;
          uVar71 = (ulong)*(uint *)(lVar70 + lVar72 * 4);
          auVar82 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar67) + uVar71 * 4);
          auVar83 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar67) + uVar71 * 4);
          *(int *)((long)&p0.field_0 + uVar80 * 4) = auVar82._0_4_;
          uVar76 = vextractps_avx(auVar82,1);
          *(undefined4 *)((long)&p0.field_0 + uVar80 * 4 + 0x10) = uVar76;
          uVar76 = vextractps_avx(auVar82,2);
          *(undefined4 *)((long)&p0.field_0 + uVar80 * 4 + 0x20) = uVar76;
          *(int *)((long)&p1.field_0 + uVar80 * 4) = auVar83._0_4_;
          uVar76 = vextractps_avx(auVar83,1);
          *(undefined4 *)((long)&p1.field_0 + uVar80 * 4 + 0x10) = uVar76;
          uVar76 = vextractps_avx(auVar83,2);
          *(undefined4 *)((long)&p1.field_0 + uVar80 * 4 + 0x20) = uVar76;
          uVar71 = uVar80 & 0x3f;
          uVar80 = 0;
          uVar63 = uVar63 ^ 1L << uVar71;
          for (uVar71 = uVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
            uVar80 = uVar80 + 1;
          }
        }
        auVar82 = vsubps_avx512vl(auVar85,auVar81);
        uVar40 = p0.field_0._0_4_;
        uVar42 = p0.field_0._4_4_;
        uVar44 = p0.field_0._8_4_;
        uVar46 = p0.field_0._12_4_;
        uVar48 = p0.field_0._32_4_;
        uVar51 = p0.field_0._36_4_;
        uVar54 = p0.field_0._40_4_;
        uVar57 = p0.field_0._44_4_;
        fVar137 = auVar82._0_4_;
        fVar145 = auVar82._4_4_;
        fVar146 = auVar82._8_4_;
        fVar147 = auVar82._12_4_;
        uVar76 = p1.field_0._0_4_;
        uVar34 = p1.field_0._4_4_;
        uVar36 = p1.field_0._8_4_;
        uVar38 = p1.field_0._12_4_;
        fVar123 = auVar81._0_4_;
        fVar129 = auVar81._4_4_;
        fVar130 = auVar81._8_4_;
        fVar131 = auVar81._12_4_;
        auVar87._0_4_ = fVar137 * (float)p0.field_0._16_4_ + fVar123 * (float)p1.field_0._16_4_;
        auVar87._4_4_ = fVar145 * (float)p0.field_0._20_4_ + fVar129 * (float)p1.field_0._20_4_;
        auVar87._8_4_ = fVar146 * (float)p0.field_0._24_4_ + fVar130 * (float)p1.field_0._24_4_;
        auVar87._12_4_ = fVar147 * (float)p0.field_0._28_4_ + fVar131 * (float)p1.field_0._28_4_;
        fVar148 = fVar123 * (float)p1.field_0._32_4_;
        fVar156 = fVar129 * (float)p1.field_0._36_4_;
        fVar157 = fVar130 * (float)p1.field_0._40_4_;
        fVar158 = fVar131 * (float)p1.field_0._44_4_;
        uVar63 = uVar64;
        uVar80 = uVar79;
        while (uVar63 != 0) {
          lVar67 = (long)itime.field_0.i[uVar80] * 0x38;
          uVar71 = (ulong)*(uint *)(lVar70 + 0x10 + lVar72 * 4);
          auVar81 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar67) + uVar71 * 4);
          auVar82 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar67) + uVar71 * 4);
          *(int *)((long)&p0.field_0 + uVar80 * 4) = auVar81._0_4_;
          uVar3 = vextractps_avx(auVar81,1);
          *(undefined4 *)((long)&p0.field_0 + uVar80 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar81,2);
          *(undefined4 *)((long)&p0.field_0 + uVar80 * 4 + 0x20) = uVar3;
          *(int *)((long)&p1.field_0 + uVar80 * 4) = auVar82._0_4_;
          uVar3 = vextractps_avx(auVar82,1);
          *(undefined4 *)((long)&p1.field_0 + uVar80 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar82,2);
          *(undefined4 *)((long)&p1.field_0 + uVar80 * 4 + 0x20) = uVar3;
          uVar71 = uVar80 & 0x3f;
          uVar80 = 0;
          uVar63 = uVar63 ^ 1L << uVar71;
          for (uVar71 = uVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
            uVar80 = uVar80 + 1;
          }
        }
        uVar41 = p0.field_0._0_4_;
        uVar43 = p0.field_0._4_4_;
        uVar45 = p0.field_0._8_4_;
        uVar47 = p0.field_0._12_4_;
        uVar49 = p0.field_0._32_4_;
        uVar52 = p0.field_0._36_4_;
        uVar55 = p0.field_0._40_4_;
        uVar58 = p0.field_0._44_4_;
        uVar3 = p1.field_0._0_4_;
        uVar35 = p1.field_0._4_4_;
        uVar37 = p1.field_0._8_4_;
        uVar39 = p1.field_0._12_4_;
        auVar89._0_4_ = fVar137 * (float)uVar40 + fVar123 * (float)uVar76;
        auVar89._4_4_ = fVar145 * (float)uVar42 + fVar129 * (float)uVar34;
        auVar89._8_4_ = fVar146 * (float)uVar44 + fVar130 * (float)uVar36;
        auVar89._12_4_ = fVar147 * (float)uVar46 + fVar131 * (float)uVar38;
        auVar92._0_4_ = fVar137 * (float)p0.field_0._16_4_ + fVar123 * (float)p1.field_0._16_4_;
        auVar92._4_4_ = fVar145 * (float)p0.field_0._20_4_ + fVar129 * (float)p1.field_0._20_4_;
        auVar92._8_4_ = fVar146 * (float)p0.field_0._24_4_ + fVar130 * (float)p1.field_0._24_4_;
        auVar92._12_4_ = fVar147 * (float)p0.field_0._28_4_ + fVar131 * (float)p1.field_0._28_4_;
        fVar168 = fVar123 * (float)p1.field_0._32_4_;
        fVar171 = fVar129 * (float)p1.field_0._36_4_;
        fVar172 = fVar130 * (float)p1.field_0._40_4_;
        fVar173 = fVar131 * (float)p1.field_0._44_4_;
        uVar63 = uVar64;
        uVar80 = uVar79;
        while (uVar63 != 0) {
          lVar67 = (long)itime.field_0.i[uVar80] * 0x38;
          uVar71 = (ulong)*(uint *)(lVar70 + 0x20 + lVar72 * 4);
          auVar81 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar67) + uVar71 * 4);
          auVar82 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar67) + uVar71 * 4);
          *(int *)((long)&p0.field_0 + uVar80 * 4) = auVar81._0_4_;
          uVar76 = vextractps_avx(auVar81,1);
          *(undefined4 *)((long)&p0.field_0 + uVar80 * 4 + 0x10) = uVar76;
          uVar76 = vextractps_avx(auVar81,2);
          *(undefined4 *)((long)&p0.field_0 + uVar80 * 4 + 0x20) = uVar76;
          *(int *)((long)&p1.field_0 + uVar80 * 4) = auVar82._0_4_;
          uVar76 = vextractps_avx(auVar82,1);
          *(undefined4 *)((long)&p1.field_0 + uVar80 * 4 + 0x10) = uVar76;
          uVar76 = vextractps_avx(auVar82,2);
          *(undefined4 *)((long)&p1.field_0 + uVar80 * 4 + 0x20) = uVar76;
          uVar71 = uVar80 & 0x3f;
          uVar80 = 0;
          uVar63 = uVar63 ^ 1L << uVar71;
          for (uVar71 = uVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
            uVar80 = uVar80 + 1;
          }
        }
        uVar40 = p0.field_0._0_4_;
        uVar42 = p0.field_0._4_4_;
        uVar44 = p0.field_0._8_4_;
        uVar46 = p0.field_0._12_4_;
        uVar50 = p0.field_0._32_4_;
        uVar53 = p0.field_0._36_4_;
        uVar56 = p0.field_0._40_4_;
        uVar59 = p0.field_0._44_4_;
        uVar76 = p1.field_0._0_4_;
        uVar34 = p1.field_0._4_4_;
        uVar36 = p1.field_0._8_4_;
        uVar38 = p1.field_0._12_4_;
        auVar91._0_4_ = (float)uVar41 * fVar137 + (float)uVar3 * fVar123;
        auVar91._4_4_ = (float)uVar43 * fVar145 + (float)uVar35 * fVar129;
        auVar91._8_4_ = (float)uVar45 * fVar146 + (float)uVar37 * fVar130;
        auVar91._12_4_ = (float)uVar47 * fVar147 + (float)uVar39 * fVar131;
        local_17f8._4_4_ = fVar145 * (float)p0.field_0._20_4_ + fVar129 * (float)p1.field_0._20_4_;
        local_17f8._0_4_ = fVar137 * (float)p0.field_0._16_4_ + fVar123 * (float)p1.field_0._16_4_;
        fStack_17f0 = fVar146 * (float)p0.field_0._24_4_ + fVar130 * (float)p1.field_0._24_4_;
        fStack_17ec = fVar147 * (float)p0.field_0._28_4_ + fVar131 * (float)p1.field_0._28_4_;
        fVar177 = fVar123 * (float)p1.field_0._32_4_;
        fVar181 = fVar129 * (float)p1.field_0._36_4_;
        fVar182 = fVar130 * (float)p1.field_0._40_4_;
        fVar183 = fVar131 * (float)p1.field_0._44_4_;
        uVar63 = uVar64;
        uVar80 = uVar79;
        while (uVar63 != 0) {
          lVar67 = (long)itime.field_0.i[uVar80] * 0x38;
          uVar71 = (ulong)*(uint *)(lVar70 + 0x30 + lVar72 * 4);
          auVar81 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar67) + uVar71 * 4);
          auVar82 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar67) + uVar71 * 4);
          *(int *)((long)&p0.field_0 + uVar80 * 4) = auVar81._0_4_;
          uVar3 = vextractps_avx(auVar81,1);
          *(undefined4 *)((long)&p0.field_0 + uVar80 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar81,2);
          *(undefined4 *)((long)&p0.field_0 + uVar80 * 4 + 0x20) = uVar3;
          *(int *)((long)&p1.field_0 + uVar80 * 4) = auVar82._0_4_;
          uVar3 = vextractps_avx(auVar82,1);
          *(undefined4 *)((long)&p1.field_0 + uVar80 * 4 + 0x10) = uVar3;
          uVar3 = vextractps_avx(auVar82,2);
          *(undefined4 *)((long)&p1.field_0 + uVar80 * 4 + 0x20) = uVar3;
          uVar71 = uVar80 & 0x3f;
          uVar80 = 0;
          uVar63 = uVar63 ^ 1L << uVar71;
          for (uVar71 = uVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
            uVar80 = uVar80 + 1;
          }
        }
        auVar90._0_4_ = fVar137 * (float)uVar48 + fVar148;
        auVar90._4_4_ = fVar145 * (float)uVar51 + fVar156;
        auVar90._8_4_ = fVar146 * (float)uVar54 + fVar157;
        auVar90._12_4_ = fVar147 * (float)uVar57 + fVar158;
        auVar93._0_4_ = fVar137 * (float)uVar49 + fVar168;
        auVar93._4_4_ = fVar145 * (float)uVar52 + fVar171;
        auVar93._8_4_ = fVar146 * (float)uVar55 + fVar172;
        auVar93._12_4_ = fVar147 * (float)uVar58 + fVar173;
        local_1808._4_4_ = fVar181 + (float)uVar53 * fVar145;
        local_1808._0_4_ = fVar177 + (float)uVar50 * fVar137;
        fStack_1800 = fVar182 + (float)uVar56 * fVar146;
        fStack_17fc = fVar183 + (float)uVar59 * fVar147;
        local_1818._4_4_ = (float)uVar42 * fVar145 + (float)uVar34 * fVar129;
        local_1818._0_4_ = (float)uVar40 * fVar137 + (float)uVar76 * fVar123;
        fStack_1810 = (float)uVar44 * fVar146 + (float)uVar36 * fVar130;
        fStack_180c = (float)uVar46 * fVar147 + (float)uVar38 * fVar131;
        auVar111._0_4_ = fVar137 * (float)p0.field_0._32_4_;
        auVar111._4_4_ = fVar145 * (float)p0.field_0._36_4_;
        auVar111._8_4_ = fVar146 * (float)p0.field_0._40_4_;
        auVar111._12_4_ = fVar147 * (float)p0.field_0._44_4_;
        auVar94._0_4_ = fVar137 * (float)p0.field_0._0_4_ + fVar123 * (float)p1.field_0._0_4_;
        auVar94._4_4_ = fVar145 * (float)p0.field_0._4_4_ + fVar129 * (float)p1.field_0._4_4_;
        auVar94._8_4_ = fVar146 * (float)p0.field_0._8_4_ + fVar130 * (float)p1.field_0._8_4_;
        auVar94._12_4_ = fVar147 * (float)p0.field_0._12_4_ + fVar131 * (float)p1.field_0._12_4_;
        auVar95._0_4_ = fVar137 * (float)p0.field_0._16_4_ + fVar123 * (float)p1.field_0._16_4_;
        auVar95._4_4_ = fVar145 * (float)p0.field_0._20_4_ + fVar129 * (float)p1.field_0._20_4_;
        auVar95._8_4_ = fVar146 * (float)p0.field_0._24_4_ + fVar130 * (float)p1.field_0._24_4_;
        auVar95._12_4_ = fVar147 * (float)p0.field_0._28_4_ + fVar131 * (float)p1.field_0._28_4_;
        auVar128._0_4_ = fVar123 * (float)p1.field_0._32_4_;
        auVar128._4_4_ = fVar129 * (float)p1.field_0._36_4_;
        auVar128._8_4_ = fVar130 * (float)p1.field_0._40_4_;
        auVar128._12_4_ = fVar131 * (float)p1.field_0._44_4_;
        auVar81 = vaddps_avx512vl(auVar111,auVar128);
      }
      auVar82 = *(undefined1 (*) [16])ray;
      auVar83 = *(undefined1 (*) [16])(ray + 0x10);
      auVar84 = *(undefined1 (*) [16])(ray + 0x20);
      auVar86 = *(undefined1 (*) [16])(ray + 0x40);
      auVar128 = *(undefined1 (*) [16])(ray + 0x50);
      auVar111 = *(undefined1 (*) [16])(ray + 0x60);
      auVar89 = vsubps_avx(auVar89,auVar82);
      auVar87 = vsubps_avx(auVar87,auVar83);
      auVar90 = vsubps_avx(auVar90,auVar84);
      auVar109 = vsubps_avx(auVar91,auVar82);
      auVar110 = vsubps_avx(auVar92,auVar83);
      auVar96 = vsubps_avx512vl(auVar93,auVar84);
      auVar97 = vsubps_avx512vl(auVar94,auVar82);
      auVar98 = vsubps_avx512vl(auVar95,auVar83);
      auVar99 = vsubps_avx512vl(auVar81,auVar84);
      auVar100 = vsubps_avx512vl(auVar97,auVar89);
      auVar101 = vsubps_avx512vl(auVar98,auVar87);
      auVar102 = vsubps_avx512vl(auVar99,auVar90);
      auVar103 = vsubps_avx512vl(auVar89,auVar109);
      auVar104 = vsubps_avx512vl(auVar87,auVar110);
      auVar105 = vsubps_avx512vl(auVar90,auVar96);
      auVar84 = vaddps_avx512vl(auVar97,auVar89);
      auVar106 = vaddps_avx512vl(auVar98,auVar87);
      auVar82 = vaddps_avx512vl(auVar99,auVar90);
      auVar165._0_4_ = auVar102._0_4_ * auVar106._0_4_;
      auVar165._4_4_ = auVar102._4_4_ * auVar106._4_4_;
      auVar165._8_4_ = auVar102._8_4_ * auVar106._8_4_;
      auVar165._12_4_ = auVar102._12_4_ * auVar106._12_4_;
      auVar83 = vfmsub231ps_fma(auVar165,auVar101,auVar82);
      auVar151._0_4_ = auVar100._0_4_ * auVar82._0_4_;
      auVar151._4_4_ = auVar100._4_4_ * auVar82._4_4_;
      auVar151._8_4_ = auVar100._8_4_ * auVar82._8_4_;
      auVar151._12_4_ = auVar100._12_4_ * auVar82._12_4_;
      auVar82 = vfmsub231ps_fma(auVar151,auVar102,auVar84);
      auVar125._0_4_ = auVar101._0_4_ * auVar84._0_4_;
      auVar125._4_4_ = auVar101._4_4_ * auVar84._4_4_;
      auVar125._8_4_ = auVar101._8_4_ * auVar84._8_4_;
      auVar125._12_4_ = auVar101._12_4_ * auVar84._12_4_;
      auVar84 = vfmsub231ps_fma(auVar125,auVar100,auVar106);
      fVar123 = auVar111._0_4_;
      auVar126._0_4_ = fVar123 * auVar84._0_4_;
      fVar129 = auVar111._4_4_;
      auVar126._4_4_ = fVar129 * auVar84._4_4_;
      fVar130 = auVar111._8_4_;
      auVar126._8_4_ = fVar130 * auVar84._8_4_;
      fVar131 = auVar111._12_4_;
      auVar126._12_4_ = fVar131 * auVar84._12_4_;
      auVar82 = vfmadd231ps_fma(auVar126,auVar128,auVar82);
      auVar82 = vfmadd231ps_fma(auVar82,auVar86,auVar83);
      auVar133._0_4_ = auVar109._0_4_ + auVar89._0_4_;
      auVar133._4_4_ = auVar109._4_4_ + auVar89._4_4_;
      auVar133._8_4_ = auVar109._8_4_ + auVar89._8_4_;
      auVar133._12_4_ = auVar109._12_4_ + auVar89._12_4_;
      auVar152._0_4_ = auVar110._0_4_ + auVar87._0_4_;
      auVar152._4_4_ = auVar110._4_4_ + auVar87._4_4_;
      auVar152._8_4_ = auVar110._8_4_ + auVar87._8_4_;
      auVar152._12_4_ = auVar110._12_4_ + auVar87._12_4_;
      auVar83 = vaddps_avx512vl(auVar90,auVar96);
      auVar84 = vmulps_avx512vl(auVar152,auVar105);
      auVar84 = vfmsub231ps_avx512vl(auVar84,auVar104,auVar83);
      auVar83 = vmulps_avx512vl(auVar83,auVar103);
      auVar83 = vfmsub231ps_avx512vl(auVar83,auVar105,auVar133);
      auVar106 = vmulps_avx512vl(auVar133,auVar104);
      auVar106 = vfmsub231ps_avx512vl(auVar106,auVar103,auVar152);
      auVar107 = vsubps_avx512vl(auVar109,auVar97);
      auVar166._0_4_ = fVar123 * auVar106._0_4_;
      auVar166._4_4_ = fVar129 * auVar106._4_4_;
      auVar166._8_4_ = fVar130 * auVar106._8_4_;
      auVar166._12_4_ = fVar131 * auVar106._12_4_;
      auVar83 = vfmadd231ps_avx512vl(auVar166,auVar128,auVar83);
      auVar106 = vsubps_avx512vl(auVar110,auVar98);
      auVar83 = vfmadd231ps_fma(auVar83,auVar86,auVar84);
      auVar108 = vsubps_avx512vl(auVar96,auVar99);
      auVar84 = vaddps_avx512vl(auVar109,auVar97);
      auVar109 = vaddps_avx512vl(auVar110,auVar98);
      auVar110 = vaddps_avx512vl(auVar96,auVar99);
      auVar96 = vmulps_avx512vl(auVar109,auVar108);
      auVar96 = vfmsub231ps_avx512vl(auVar96,auVar106,auVar110);
      auVar110 = vmulps_avx512vl(auVar110,auVar107);
      auVar110 = vfmsub231ps_avx512vl(auVar110,auVar108,auVar84);
      auVar185._0_4_ = auVar84._0_4_ * auVar106._0_4_;
      auVar185._4_4_ = auVar84._4_4_ * auVar106._4_4_;
      auVar185._8_4_ = auVar84._8_4_ * auVar106._8_4_;
      auVar185._12_4_ = auVar84._12_4_ * auVar106._12_4_;
      auVar84 = vfmsub231ps_fma(auVar185,auVar107,auVar109);
      auVar84 = vmulps_avx512vl(auVar84,auVar111);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar128,auVar110);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar86,auVar96);
      auVar186._0_4_ = auVar82._0_4_ + auVar83._0_4_;
      auVar186._4_4_ = auVar82._4_4_ + auVar83._4_4_;
      auVar186._8_4_ = auVar82._8_4_ + auVar83._8_4_;
      auVar186._12_4_ = auVar82._12_4_ + auVar83._12_4_;
      auVar111 = vaddps_avx512vl(auVar84,auVar186);
      auVar98 = auVar189._0_16_;
      auVar109 = vandps_avx512vl(auVar111,auVar98);
      auVar110 = vmulps_avx512vl(auVar109,auVar188._0_16_);
      auVar96 = vminps_avx512vl(auVar82,auVar83);
      auVar96 = vminps_avx512vl(auVar96,auVar84);
      auVar97 = vxorps_avx512vl(auVar110,auVar187._0_16_);
      uVar10 = vcmpps_avx512vl(auVar96,auVar97,5);
      auVar96 = vmaxps_avx512vl(auVar82,auVar83);
      auVar84 = vmaxps_avx512vl(auVar96,auVar84);
      uVar11 = vcmpps_avx512vl(auVar84,auVar110,2);
      bVar74 = ((byte)uVar10 | (byte)uVar11) & 0xf & bVar75;
      if (bVar74 != 0) {
        auVar84 = vmulps_avx512vl(auVar104,auVar102);
        auVar110 = vmulps_avx512vl(auVar100,auVar105);
        auVar96 = vmulps_avx512vl(auVar103,auVar101);
        auVar97 = vmulps_avx512vl(auVar106,auVar105);
        auVar99 = vmulps_avx512vl(auVar103,auVar108);
        auVar112 = vmulps_avx512vl(auVar107,auVar104);
        auVar101 = vfmsub213ps_avx512vl(auVar101,auVar105,auVar84);
        auVar102 = vfmsub213ps_avx512vl(auVar102,auVar103,auVar110);
        auVar100 = vfmsub213ps_avx512vl(auVar100,auVar104,auVar96);
        auVar104 = vfmsub213ps_avx512vl(auVar108,auVar104,auVar97);
        auVar105 = vfmsub213ps_avx512vl(auVar107,auVar105,auVar99);
        auVar103 = vfmsub213ps_avx512vl(auVar106,auVar103,auVar112);
        auVar84 = vandps_avx512vl(auVar84,auVar98);
        auVar97 = vandps_avx512vl(auVar97,auVar98);
        uVar80 = vcmpps_avx512vl(auVar84,auVar97,1);
        auVar84 = vandps_avx512vl(auVar110,auVar98);
        auVar110 = vandps_avx512vl(auVar99,auVar98);
        uVar63 = vcmpps_avx512vl(auVar84,auVar110,1);
        auVar84 = vandps_avx512vl(auVar96,auVar98);
        auVar110 = vandps_avx512vl(auVar112,auVar98);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar187 = ZEXT1664(auVar96);
        uVar71 = vcmpps_avx512vl(auVar84,auVar110,1);
        bVar61 = (bool)((byte)uVar80 & 1);
        vVar113.field_0._0_4_ = (uint)bVar61 * auVar101._0_4_ | (uint)!bVar61 * auVar104._0_4_;
        bVar61 = (bool)((byte)(uVar80 >> 1) & 1);
        vVar113.field_0._4_4_ = (uint)bVar61 * auVar101._4_4_ | (uint)!bVar61 * auVar104._4_4_;
        bVar61 = (bool)((byte)(uVar80 >> 2) & 1);
        vVar113.field_0._8_4_ = (uint)bVar61 * auVar101._8_4_ | (uint)!bVar61 * auVar104._8_4_;
        bVar61 = (bool)((byte)(uVar80 >> 3) & 1);
        vVar113.field_0._12_4_ = (uint)bVar61 * auVar101._12_4_ | (uint)!bVar61 * auVar104._12_4_;
        bVar61 = (bool)((byte)uVar63 & 1);
        vVar114.field_0._0_4_ = (uint)bVar61 * auVar102._0_4_ | (uint)!bVar61 * auVar105._0_4_;
        bVar61 = (bool)((byte)(uVar63 >> 1) & 1);
        vVar114.field_0._4_4_ = (uint)bVar61 * auVar102._4_4_ | (uint)!bVar61 * auVar105._4_4_;
        bVar61 = (bool)((byte)(uVar63 >> 2) & 1);
        vVar114.field_0._8_4_ = (uint)bVar61 * auVar102._8_4_ | (uint)!bVar61 * auVar105._8_4_;
        bVar61 = (bool)((byte)(uVar63 >> 3) & 1);
        vVar114.field_0._12_4_ = (uint)bVar61 * auVar102._12_4_ | (uint)!bVar61 * auVar105._12_4_;
        bVar61 = (bool)((byte)uVar71 & 1);
        vVar115.field_0._0_4_ =
             (float)((uint)bVar61 * auVar100._0_4_ | (uint)!bVar61 * auVar103._0_4_);
        bVar61 = (bool)((byte)(uVar71 >> 1) & 1);
        vVar115.field_0._4_4_ =
             (float)((uint)bVar61 * auVar100._4_4_ | (uint)!bVar61 * auVar103._4_4_);
        bVar61 = (bool)((byte)(uVar71 >> 2) & 1);
        vVar115.field_0._8_4_ =
             (float)((uint)bVar61 * auVar100._8_4_ | (uint)!bVar61 * auVar103._8_4_);
        bVar61 = (bool)((byte)(uVar71 >> 3) & 1);
        vVar115.field_0._12_4_ =
             (float)((uint)bVar61 * auVar100._12_4_ | (uint)!bVar61 * auVar103._12_4_);
        auVar175._0_4_ = fVar123 * vVar115.field_0._0_4_;
        auVar175._4_4_ = fVar129 * vVar115.field_0._4_4_;
        auVar175._8_4_ = fVar130 * vVar115.field_0._8_4_;
        auVar175._12_4_ = fVar131 * vVar115.field_0._12_4_;
        auVar84 = vfmadd213ps_fma(auVar128,(undefined1  [16])vVar114.field_0,auVar175);
        auVar84 = vfmadd213ps_fma(auVar86,(undefined1  [16])vVar113.field_0,auVar84);
        auVar161._0_4_ = auVar84._0_4_ + auVar84._0_4_;
        auVar161._4_4_ = auVar84._4_4_ + auVar84._4_4_;
        auVar161._8_4_ = auVar84._8_4_ + auVar84._8_4_;
        auVar161._12_4_ = auVar84._12_4_ + auVar84._12_4_;
        auVar169._0_4_ = auVar90._0_4_ * vVar115.field_0._0_4_;
        auVar169._4_4_ = auVar90._4_4_ * vVar115.field_0._4_4_;
        auVar169._8_4_ = auVar90._8_4_ * vVar115.field_0._8_4_;
        auVar169._12_4_ = auVar90._12_4_ * vVar115.field_0._12_4_;
        auVar84 = vfmadd213ps_fma(auVar87,(undefined1  [16])vVar114.field_0,auVar169);
        auVar86 = vfmadd213ps_fma(auVar89,(undefined1  [16])vVar113.field_0,auVar84);
        auVar84 = vrcp14ps_avx512vl(auVar161);
        auVar87 = vxorps_avx512vl(auVar161,auVar96);
        auVar89 = vfnmadd213ps_avx512vl(auVar84,auVar161,auVar85);
        auVar84 = vfmadd132ps_fma(auVar89,auVar84,auVar84);
        auVar136._0_4_ = auVar84._0_4_ * (auVar86._0_4_ + auVar86._0_4_);
        auVar136._4_4_ = auVar84._4_4_ * (auVar86._4_4_ + auVar86._4_4_);
        auVar136._8_4_ = auVar84._8_4_ * (auVar86._8_4_ + auVar86._8_4_);
        auVar136._12_4_ = auVar84._12_4_ * (auVar86._12_4_ + auVar86._12_4_);
        uVar10 = vcmpps_avx512vl(auVar136,*(undefined1 (*) [16])(ray + 0x80),2);
        uVar11 = vcmpps_avx512vl(auVar136,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar12 = vcmpps_avx512vl(auVar161,auVar87,4);
        bVar74 = bVar74 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
        if (bVar74 != 0) {
          uVar1 = pGVar5->mask;
          auVar140._4_4_ = uVar1;
          auVar140._0_4_ = uVar1;
          auVar140._8_4_ = uVar1;
          auVar140._12_4_ = uVar1;
          uVar10 = vptestmd_avx512vl(auVar140,*(undefined1 (*) [16])(ray + 0x90));
          bVar74 = bVar74 & (byte)uVar10 & 0xf;
          uVar80 = (ulong)bVar74;
          if (bVar74 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar30._8_4_ = 0x219392ef;
              auVar30._0_8_ = 0x219392ef219392ef;
              auVar30._12_4_ = 0x219392ef;
              uVar63 = vcmpps_avx512vl(auVar109,auVar30,5);
              auVar84 = vrcp14ps_avx512vl(auVar111);
              auVar86 = vfnmadd213ps_avx512vl(auVar111,auVar84,auVar85);
              auVar84 = vfmadd132ps_avx512vl(auVar86,auVar84,auVar84);
              fVar131 = (float)((uint)((byte)uVar63 & 1) * auVar84._0_4_);
              fVar130 = (float)((uint)((byte)(uVar63 >> 1) & 1) * auVar84._4_4_);
              fVar129 = (float)((uint)((byte)(uVar63 >> 2) & 1) * auVar84._8_4_);
              fVar123 = (float)((uint)((byte)(uVar63 >> 3) & 1) * auVar84._12_4_);
              auVar127._0_4_ = fVar131 * auVar82._0_4_;
              auVar127._4_4_ = fVar130 * auVar82._4_4_;
              auVar127._8_4_ = fVar129 * auVar82._8_4_;
              auVar127._12_4_ = fVar123 * auVar82._12_4_;
              vminps_avx512vl(auVar127,auVar85);
              auVar143._0_4_ = fVar131 * auVar83._0_4_;
              auVar143._4_4_ = fVar130 * auVar83._4_4_;
              auVar143._8_4_ = fVar129 * auVar83._8_4_;
              auVar143._12_4_ = fVar123 * auVar83._12_4_;
              vminps_avx512vl(auVar143,auVar85);
              p1.field_0._0_8_ = &itime;
              p1.field_0._8_8_ = &t;
              p1.field_0._16_8_ = &v_1;
              p1.field_0._24_8_ = &u;
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar113.field_0;
              p0.field_0.field_0.y.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar114.field_0;
              p0.field_0.field_0.z.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar115.field_0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&p0);
              auVar85 = vpbroadcastd_avx512vl();
              vpbroadcastd_avx512vl();
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
              p0.field_0._24_8_ = uStack_1880;
              p0.field_0._16_8_ = local_1888;
              p0.field_0._40_8_ = uStack_1870;
              p0.field_0._32_8_ = uStack_1878;
              vpcmpeqd_avx2(ZEXT1632(auVar85),ZEXT1632(auVar85));
              uVar1 = context->user->instPrimID[0];
              auVar85 = *(undefined1 (*) [16])(ray + 0x80);
              auVar82 = vblendmps_avx512vl(auVar85,(undefined1  [16])t.field_0);
              bVar61 = (bool)(bVar74 >> 1 & 1);
              bVar7 = (bool)(bVar74 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar74 & 1) * auVar82._0_4_ | !(bool)(bVar74 & 1) * uVar1;
              *(uint *)(ray + 0x84) = (uint)bVar61 * auVar82._4_4_ | !bVar61 * uVar1;
              *(uint *)(ray + 0x88) = (uint)bVar7 * auVar82._8_4_ | !bVar7 * uVar1;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar74 >> 3) * auVar82._12_4_ | !(bool)(bVar74 >> 3) * uVar1;
              local_1968 = vpmovm2d_avx512vl(uVar80);
              p1.field_0._0_8_ = local_1968;
              p1.field_0._8_8_ = pGVar5->userPtr;
              p1.field_0._16_8_ = context->user;
              p1.field_0._32_8_ = &p0;
              p1.field_0._40_4_ = 4;
              p1.field_0._24_8_ = ray;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
              }
              uVar80 = vptestmd_avx512vl(local_1968,local_1968);
              if ((uVar80 & 0xf) == 0) {
                uVar80 = 0;
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar189 = ZEXT1664(auVar82);
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar190 = ZEXT1664(auVar82);
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar191 = ZEXT1664(auVar82);
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar192 = ZEXT1664(auVar82);
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar193 = ZEXT1664(auVar82);
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar188 = ZEXT1664(auVar82);
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar187 = ZEXT1664(auVar82);
              }
              else {
                p_Var6 = context->args->filter;
                if (p_Var6 == (RTCFilterFunctionN)0x0) {
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar189 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar190 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar191 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar192 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar193 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar188 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar187 = ZEXT1664(auVar82);
                }
                else {
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar189 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar190 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar191 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar192 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar193 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar188 = ZEXT1664(auVar82);
                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar187 = ZEXT1664(auVar82);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar187 = ZEXT1664(auVar82);
                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar188 = ZEXT1664(auVar82);
                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar193 = ZEXT1664(auVar82);
                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar192 = ZEXT1664(auVar82);
                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar191 = ZEXT1664(auVar82);
                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar190 = ZEXT1664(auVar82);
                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar189 = ZEXT1664(auVar82);
                  }
                }
                uVar80 = vptestmd_avx512vl(local_1968,local_1968);
                uVar80 = uVar80 & 0xf;
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar61 = (bool)((byte)uVar80 & 1);
                auVar119._0_4_ =
                     (uint)bVar61 * auVar82._0_4_ |
                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x80);
                bVar61 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar119._4_4_ =
                     (uint)bVar61 * auVar82._4_4_ |
                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x84);
                bVar61 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar119._8_4_ =
                     (uint)bVar61 * auVar82._8_4_ |
                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x88);
                bVar61 = SUB81(uVar80 >> 3,0);
                auVar119._12_4_ =
                     (uint)bVar61 * auVar82._12_4_ |
                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x8c);
                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar119;
              }
              bVar61 = (bool)((byte)uVar80 & 1);
              auVar120._0_4_ = (uint)bVar61 * *(int *)local_1958 | (uint)!bVar61 * auVar85._0_4_;
              bVar61 = (bool)((byte)(uVar80 >> 1) & 1);
              auVar120._4_4_ =
                   (uint)bVar61 * *(int *)(local_1958 + 4) | (uint)!bVar61 * auVar85._4_4_;
              bVar61 = (bool)((byte)(uVar80 >> 2) & 1);
              auVar120._8_4_ =
                   (uint)bVar61 * *(int *)(local_1958 + 8) | (uint)!bVar61 * auVar85._8_4_;
              bVar61 = SUB81(uVar80 >> 3,0);
              auVar120._12_4_ =
                   (uint)bVar61 * *(int *)(local_1958 + 0xc) | (uint)!bVar61 * auVar85._12_4_;
              *(undefined1 (*) [16])local_1958 = auVar120;
            }
            bVar75 = ((byte)uVar80 ^ 0xf) & bVar75;
          }
        }
      }
      if (bVar75 == 0) {
        bVar75 = 0;
        goto LAB_01c9b2db;
      }
      auVar85 = *(undefined1 (*) [16])ray;
      auVar82 = *(undefined1 (*) [16])(ray + 0x10);
      auVar83 = *(undefined1 (*) [16])(ray + 0x20);
      auVar84 = *(undefined1 (*) [16])(ray + 0x40);
      auVar86 = *(undefined1 (*) [16])(ray + 0x50);
      auVar87 = *(undefined1 (*) [16])(ray + 0x60);
      auVar89 = vsubps_avx(_local_1818,auVar85);
      auVar90 = vsubps_avx(_local_17f8,auVar82);
      auVar128 = vsubps_avx(_local_1808,auVar83);
      auVar94 = vsubps_avx(auVar94,auVar85);
      auVar95 = vsubps_avx(auVar95,auVar82);
      auVar111 = vsubps_avx512vl(auVar81,auVar83);
      auVar85 = vsubps_avx512vl(auVar91,auVar85);
      auVar82 = vsubps_avx512vl(auVar92,auVar82);
      auVar83 = vsubps_avx512vl(auVar93,auVar83);
      auVar92 = vsubps_avx512vl(auVar85,auVar89);
      auVar91 = vsubps_avx512vl(auVar82,auVar90);
      auVar93 = vsubps_avx512vl(auVar83,auVar128);
      auVar109 = vsubps_avx512vl(auVar89,auVar94);
      auVar110 = vsubps_avx512vl(auVar90,auVar95);
      auVar96 = vsubps_avx512vl(auVar128,auVar111);
      auVar97 = vsubps_avx512vl(auVar94,auVar85);
      auVar98 = vsubps_avx512vl(auVar95,auVar82);
      auVar99 = vsubps_avx512vl(auVar111,auVar83);
      auVar81 = vaddps_avx512vl(auVar85,auVar89);
      auVar100 = vaddps_avx512vl(auVar82,auVar90);
      auVar101 = vaddps_avx512vl(auVar83,auVar128);
      auVar102 = vmulps_avx512vl(auVar100,auVar93);
      auVar102 = vfmsub231ps_avx512vl(auVar102,auVar91,auVar101);
      auVar101 = vmulps_avx512vl(auVar101,auVar92);
      auVar101 = vfmsub231ps_avx512vl(auVar101,auVar93,auVar81);
      auVar141._0_4_ = auVar91._0_4_ * auVar81._0_4_;
      auVar141._4_4_ = auVar91._4_4_ * auVar81._4_4_;
      auVar141._8_4_ = auVar91._8_4_ * auVar81._8_4_;
      auVar141._12_4_ = auVar91._12_4_ * auVar81._12_4_;
      auVar81 = vfmsub231ps_fma(auVar141,auVar92,auVar100);
      fVar123 = auVar87._0_4_;
      auVar142._0_4_ = fVar123 * auVar81._0_4_;
      fVar129 = auVar87._4_4_;
      auVar142._4_4_ = fVar129 * auVar81._4_4_;
      fVar130 = auVar87._8_4_;
      auVar142._8_4_ = fVar130 * auVar81._8_4_;
      fVar131 = auVar87._12_4_;
      auVar142._12_4_ = fVar131 * auVar81._12_4_;
      auVar81 = vfmadd231ps_avx512vl(auVar142,auVar86,auVar101);
      auVar100 = vfmadd231ps_avx512vl(auVar81,auVar84,auVar102);
      auVar153._0_4_ = auVar94._0_4_ + auVar89._0_4_;
      auVar153._4_4_ = auVar94._4_4_ + auVar89._4_4_;
      auVar153._8_4_ = auVar94._8_4_ + auVar89._8_4_;
      auVar153._12_4_ = auVar94._12_4_ + auVar89._12_4_;
      auVar81 = vaddps_avx512vl(auVar90,auVar95);
      auVar101 = vaddps_avx512vl(auVar128,auVar111);
      auVar102 = vmulps_avx512vl(auVar81,auVar96);
      auVar102 = vfmsub231ps_avx512vl(auVar102,auVar110,auVar101);
      auVar101 = vmulps_avx512vl(auVar101,auVar109);
      auVar101 = vfmsub231ps_avx512vl(auVar101,auVar96,auVar153);
      auVar103 = vmulps_avx512vl(auVar153,auVar110);
      auVar81 = vfmsub231ps_avx512vl(auVar103,auVar109,auVar81);
      auVar154._0_4_ = fVar123 * auVar81._0_4_;
      auVar154._4_4_ = fVar129 * auVar81._4_4_;
      auVar154._8_4_ = fVar130 * auVar81._8_4_;
      auVar154._12_4_ = fVar131 * auVar81._12_4_;
      auVar81 = vfmadd231ps_avx512vl(auVar154,auVar86,auVar101);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar187 = ZEXT1664(auVar101);
      auVar102 = vfmadd231ps_avx512vl(auVar81,auVar84,auVar102);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar188 = ZEXT1664(auVar103);
      auVar81 = vaddps_avx512vl(auVar94,auVar85);
      auVar85 = vaddps_avx512vl(auVar95,auVar82);
      auVar82 = vaddps_avx512vl(auVar111,auVar83);
      auVar83 = vmulps_avx512vl(auVar85,auVar99);
      auVar83 = vfmsub231ps_avx512vl(auVar83,auVar98,auVar82);
      auVar82 = vmulps_avx512vl(auVar82,auVar97);
      auVar82 = vfmsub231ps_avx512vl(auVar82,auVar99,auVar81);
      auVar179._0_4_ = auVar81._0_4_ * auVar98._0_4_;
      auVar179._4_4_ = auVar81._4_4_ * auVar98._4_4_;
      auVar179._8_4_ = auVar81._8_4_ * auVar98._8_4_;
      auVar179._12_4_ = auVar81._12_4_ * auVar98._12_4_;
      auVar81 = vfmsub231ps_fma(auVar179,auVar97,auVar85);
      auVar81 = vmulps_avx512vl(auVar81,auVar87);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar82);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar84,auVar83);
      auVar180._0_4_ = auVar100._0_4_ + auVar102._0_4_;
      auVar180._4_4_ = auVar100._4_4_ + auVar102._4_4_;
      auVar180._8_4_ = auVar100._8_4_ + auVar102._8_4_;
      auVar180._12_4_ = auVar100._12_4_ + auVar102._12_4_;
      auVar85 = vaddps_avx512vl(auVar81,auVar180);
      auVar95 = auVar189._0_16_;
      auVar82 = vandps_avx512vl(auVar85,auVar95);
      auVar83 = vmulps_avx512vl(auVar82,auVar103);
      auVar87 = vminps_avx512vl(auVar100,auVar102);
      auVar87 = vminps_avx512vl(auVar87,auVar81);
      auVar94 = vxorps_avx512vl(auVar83,auVar101);
      uVar10 = vcmpps_avx512vl(auVar87,auVar94,5);
      auVar87 = vmaxps_avx512vl(auVar100,auVar102);
      auVar81 = vmaxps_avx512vl(auVar87,auVar81);
      uVar11 = vcmpps_avx512vl(auVar81,auVar83,2);
      bVar74 = ((byte)uVar10 | (byte)uVar11) & 0xf & bVar75;
      if (bVar74 != 0) {
        auVar81 = vmulps_avx512vl(auVar110,auVar93);
        auVar83 = vmulps_avx512vl(auVar92,auVar96);
        auVar87 = vmulps_avx512vl(auVar109,auVar91);
        auVar94 = vmulps_avx512vl(auVar98,auVar96);
        auVar111 = vmulps_avx512vl(auVar109,auVar99);
        auVar101 = vmulps_avx512vl(auVar97,auVar110);
        auVar91 = vfmsub213ps_avx512vl(auVar91,auVar96,auVar81);
        auVar93 = vfmsub213ps_avx512vl(auVar93,auVar109,auVar83);
        auVar92 = vfmsub213ps_avx512vl(auVar92,auVar110,auVar87);
        auVar110 = vfmsub213ps_avx512vl(auVar99,auVar110,auVar94);
        auVar96 = vfmsub213ps_avx512vl(auVar97,auVar96,auVar111);
        auVar109 = vfmsub213ps_avx512vl(auVar98,auVar109,auVar101);
        auVar81 = vandps_avx512vl(auVar81,auVar95);
        auVar94 = vandps_avx512vl(auVar94,auVar95);
        uVar80 = vcmpps_avx512vl(auVar81,auVar94,1);
        auVar81 = vandps_avx512vl(auVar83,auVar95);
        auVar83 = vandps_avx512vl(auVar111,auVar95);
        uVar63 = vcmpps_avx512vl(auVar81,auVar83,1);
        auVar81 = vandps_avx512vl(auVar87,auVar95);
        auVar83 = vandps_avx512vl(auVar101,auVar95);
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar187 = ZEXT1664(auVar87);
        uVar71 = vcmpps_avx512vl(auVar81,auVar83,1);
        bVar61 = (bool)((byte)uVar80 & 1);
        vVar116.field_0._0_4_ = (uint)bVar61 * auVar91._0_4_ | (uint)!bVar61 * auVar110._0_4_;
        bVar61 = (bool)((byte)(uVar80 >> 1) & 1);
        vVar116.field_0._4_4_ = (uint)bVar61 * auVar91._4_4_ | (uint)!bVar61 * auVar110._4_4_;
        bVar61 = (bool)((byte)(uVar80 >> 2) & 1);
        vVar116.field_0._8_4_ = (uint)bVar61 * auVar91._8_4_ | (uint)!bVar61 * auVar110._8_4_;
        bVar61 = (bool)((byte)(uVar80 >> 3) & 1);
        vVar116.field_0._12_4_ = (uint)bVar61 * auVar91._12_4_ | (uint)!bVar61 * auVar110._12_4_;
        bVar61 = (bool)((byte)uVar63 & 1);
        vVar117.field_0._0_4_ = (uint)bVar61 * auVar93._0_4_ | (uint)!bVar61 * auVar96._0_4_;
        bVar61 = (bool)((byte)(uVar63 >> 1) & 1);
        vVar117.field_0._4_4_ = (uint)bVar61 * auVar93._4_4_ | (uint)!bVar61 * auVar96._4_4_;
        bVar61 = (bool)((byte)(uVar63 >> 2) & 1);
        vVar117.field_0._8_4_ = (uint)bVar61 * auVar93._8_4_ | (uint)!bVar61 * auVar96._8_4_;
        bVar61 = (bool)((byte)(uVar63 >> 3) & 1);
        vVar117.field_0._12_4_ = (uint)bVar61 * auVar93._12_4_ | (uint)!bVar61 * auVar96._12_4_;
        bVar61 = (bool)((byte)uVar71 & 1);
        vVar118.field_0._0_4_ =
             (float)((uint)bVar61 * auVar92._0_4_ | (uint)!bVar61 * auVar109._0_4_);
        bVar61 = (bool)((byte)(uVar71 >> 1) & 1);
        vVar118.field_0._4_4_ =
             (float)((uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar109._4_4_);
        bVar61 = (bool)((byte)(uVar71 >> 2) & 1);
        vVar118.field_0._8_4_ =
             (float)((uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar109._8_4_);
        bVar61 = (bool)((byte)(uVar71 >> 3) & 1);
        vVar118.field_0._12_4_ =
             (float)((uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar109._12_4_);
        auVar176._0_4_ = fVar123 * vVar118.field_0._0_4_;
        auVar176._4_4_ = fVar129 * vVar118.field_0._4_4_;
        auVar176._8_4_ = fVar130 * vVar118.field_0._8_4_;
        auVar176._12_4_ = fVar131 * vVar118.field_0._12_4_;
        auVar81 = vfmadd213ps_fma(auVar86,(undefined1  [16])vVar117.field_0,auVar176);
        auVar81 = vfmadd213ps_fma(auVar84,(undefined1  [16])vVar116.field_0,auVar81);
        auVar170._0_4_ = auVar81._0_4_ + auVar81._0_4_;
        auVar170._4_4_ = auVar81._4_4_ + auVar81._4_4_;
        auVar170._8_4_ = auVar81._8_4_ + auVar81._8_4_;
        auVar170._12_4_ = auVar81._12_4_ + auVar81._12_4_;
        auVar174._0_4_ = auVar128._0_4_ * vVar118.field_0._0_4_;
        auVar174._4_4_ = auVar128._4_4_ * vVar118.field_0._4_4_;
        auVar174._8_4_ = auVar128._8_4_ * vVar118.field_0._8_4_;
        auVar174._12_4_ = auVar128._12_4_ * vVar118.field_0._12_4_;
        auVar81 = vfmadd213ps_fma(auVar90,(undefined1  [16])vVar117.field_0,auVar174);
        auVar83 = vfmadd213ps_fma(auVar89,(undefined1  [16])vVar116.field_0,auVar81);
        auVar81 = vrcp14ps_avx512vl(auVar170);
        auVar84 = vxorps_avx512vl(auVar170,auVar87);
        auVar87 = auVar190._0_16_;
        auVar86 = vfnmadd213ps_avx512vl(auVar81,auVar170,auVar87);
        auVar81 = vfmadd132ps_fma(auVar86,auVar81,auVar81);
        auVar162._0_4_ = auVar81._0_4_ * (auVar83._0_4_ + auVar83._0_4_);
        auVar162._4_4_ = auVar81._4_4_ * (auVar83._4_4_ + auVar83._4_4_);
        auVar162._8_4_ = auVar81._8_4_ * (auVar83._8_4_ + auVar83._8_4_);
        auVar162._12_4_ = auVar81._12_4_ * (auVar83._12_4_ + auVar83._12_4_);
        uVar10 = vcmpps_avx512vl(auVar162,*(undefined1 (*) [16])(ray + 0x80),2);
        uVar11 = vcmpps_avx512vl(auVar162,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar12 = vcmpps_avx512vl(auVar170,auVar84,4);
        bVar74 = bVar74 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
        if (bVar74 != 0) {
          pGVar5 = (context->scene->geometries).items[*(uint *)(lVar70 + 0x40 + lVar72 * 4)].ptr;
          uVar1 = pGVar5->mask;
          auVar167._4_4_ = uVar1;
          auVar167._0_4_ = uVar1;
          auVar167._8_4_ = uVar1;
          auVar167._12_4_ = uVar1;
          uVar10 = vptestmd_avx512vl(auVar167,*(undefined1 (*) [16])(ray + 0x90));
          bVar74 = bVar74 & (byte)uVar10 & 0xf;
          uVar80 = (ulong)bVar74;
          if (bVar74 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar29._8_4_ = 0x219392ef;
              auVar29._0_8_ = 0x219392ef219392ef;
              auVar29._12_4_ = 0x219392ef;
              uVar63 = vcmpps_avx512vl(auVar82,auVar29,5);
              auVar81 = vrcp14ps_avx512vl(auVar85);
              auVar85 = vfnmadd213ps_avx512vl(auVar85,auVar81,auVar87);
              auVar81 = vfmadd132ps_avx512vl(auVar85,auVar81,auVar81);
              fVar131 = (float)((uint)((byte)uVar63 & 1) * auVar81._0_4_);
              fVar130 = (float)((uint)((byte)(uVar63 >> 1) & 1) * auVar81._4_4_);
              fVar129 = (float)((uint)((byte)(uVar63 >> 2) & 1) * auVar81._8_4_);
              fVar123 = (float)((uint)((byte)(uVar63 >> 3) & 1) * auVar81._12_4_);
              auVar144._0_4_ = fVar131 * auVar100._0_4_;
              auVar144._4_4_ = fVar130 * auVar100._4_4_;
              auVar144._8_4_ = fVar129 * auVar100._8_4_;
              auVar144._12_4_ = fVar123 * auVar100._12_4_;
              auVar81 = vminps_avx512vl(auVar144,auVar87);
              auVar155._0_4_ = fVar131 * auVar102._0_4_;
              auVar155._4_4_ = fVar130 * auVar102._4_4_;
              auVar155._8_4_ = fVar129 * auVar102._8_4_;
              auVar155._12_4_ = fVar123 * auVar102._12_4_;
              auVar85 = vminps_avx512vl(auVar155,auVar87);
              vsubps_avx512vl(auVar87,auVar81);
              vsubps_avx512vl(auVar87,auVar85);
              p1.field_0._0_8_ = &itime;
              p1.field_0._8_8_ = &t;
              p1.field_0._16_8_ = &v_1;
              p1.field_0._24_8_ = &u;
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar116.field_0;
              p0.field_0.field_0.y.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar117.field_0;
              p0.field_0.field_0.z.field_0 = (vfloat_impl<4>)(undefined1  [16])vVar118.field_0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&p0);
              auVar81 = vpbroadcastd_avx512vl();
              vpbroadcastd_avx512vl();
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
              p0.field_0._24_8_ = uStack_1880;
              p0.field_0._16_8_ = local_1888;
              p0.field_0._40_8_ = uStack_1870;
              p0.field_0._32_8_ = uStack_1878;
              vpcmpeqd_avx2(ZEXT1632(auVar81),ZEXT1632(auVar81));
              uVar1 = context->user->instPrimID[0];
              auVar81 = *(undefined1 (*) [16])(ray + 0x80);
              auVar85 = vblendmps_avx512vl(auVar81,(undefined1  [16])t.field_0);
              bVar61 = (bool)(bVar74 >> 1 & 1);
              bVar7 = (bool)(bVar74 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar74 & 1) * auVar85._0_4_ | !(bool)(bVar74 & 1) * uVar1;
              *(uint *)(ray + 0x84) = (uint)bVar61 * auVar85._4_4_ | !bVar61 * uVar1;
              *(uint *)(ray + 0x88) = (uint)bVar7 * auVar85._8_4_ | !bVar7 * uVar1;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar74 >> 3) * auVar85._12_4_ | !(bool)(bVar74 >> 3) * uVar1;
              local_1968 = vpmovm2d_avx512vl(uVar80);
              p1.field_0._0_8_ = local_1968;
              p1.field_0._8_8_ = pGVar5->userPtr;
              p1.field_0._16_8_ = context->user;
              p1.field_0._32_8_ = &p0;
              p1.field_0._40_4_ = 4;
              p1.field_0._24_8_ = ray;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
              }
              uVar80 = vptestmd_avx512vl(local_1968,local_1968);
              if ((uVar80 & 0xf) == 0) {
                uVar80 = 0;
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar189 = ZEXT1664(auVar85);
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar190 = ZEXT1664(auVar85);
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar191 = ZEXT1664(auVar85);
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar192 = ZEXT1664(auVar85);
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar193 = ZEXT1664(auVar85);
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar188 = ZEXT1664(auVar85);
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar187 = ZEXT1664(auVar85);
              }
              else {
                p_Var6 = context->args->filter;
                if (p_Var6 == (RTCFilterFunctionN)0x0) {
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar189 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar190 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar191 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar192 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar193 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar188 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar187 = ZEXT1664(auVar85);
                }
                else {
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar189 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar190 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar191 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar192 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar193 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar188 = ZEXT1664(auVar85);
                  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar187 = ZEXT1664(auVar85);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar187 = ZEXT1664(auVar85);
                    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar188 = ZEXT1664(auVar85);
                    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar193 = ZEXT1664(auVar85);
                    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar192 = ZEXT1664(auVar85);
                    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar191 = ZEXT1664(auVar85);
                    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar190 = ZEXT1664(auVar85);
                    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar189 = ZEXT1664(auVar85);
                  }
                }
                uVar80 = vptestmd_avx512vl(local_1968,local_1968);
                uVar80 = uVar80 & 0xf;
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar61 = (bool)((byte)uVar80 & 1);
                auVar121._0_4_ =
                     (uint)bVar61 * auVar85._0_4_ |
                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x80);
                bVar61 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar121._4_4_ =
                     (uint)bVar61 * auVar85._4_4_ |
                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x84);
                bVar61 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar121._8_4_ =
                     (uint)bVar61 * auVar85._8_4_ |
                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x88);
                bVar61 = SUB81(uVar80 >> 3,0);
                auVar121._12_4_ =
                     (uint)bVar61 * auVar85._12_4_ |
                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x8c);
                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar121;
              }
              bVar61 = (bool)((byte)uVar80 & 1);
              auVar122._0_4_ = (uint)bVar61 * *(int *)local_1958 | (uint)!bVar61 * auVar81._0_4_;
              bVar61 = (bool)((byte)(uVar80 >> 1) & 1);
              auVar122._4_4_ =
                   (uint)bVar61 * *(int *)(local_1958 + 4) | (uint)!bVar61 * auVar81._4_4_;
              bVar61 = (bool)((byte)(uVar80 >> 2) & 1);
              auVar122._8_4_ =
                   (uint)bVar61 * *(int *)(local_1958 + 8) | (uint)!bVar61 * auVar81._8_4_;
              bVar61 = SUB81(uVar80 >> 3,0);
              auVar122._12_4_ =
                   (uint)bVar61 * *(int *)(local_1958 + 0xc) | (uint)!bVar61 * auVar81._12_4_;
              *(undefined1 (*) [16])local_1958 = auVar122;
            }
            bVar75 = ((byte)uVar80 ^ 0xf) & bVar75;
          }
        }
      }
      lVar72 = lVar72 + 1;
    } while (bVar75 != 0);
    bVar75 = 0;
LAB_01c9b2db:
    lVar65 = lVar65 + 1;
    bVar60 = bVar60 & bVar75;
  } while (bVar60 != 0);
  bVar60 = 0;
LAB_01c9b2f6:
  bVar60 = (byte)local_1a24 | ~bVar60 & 0xf;
  local_1a24 = (uint)bVar60;
  if (bVar60 == 0xf) {
    local_1a24._0_1_ = 0xf;
    goto LAB_01c9b453;
  }
  auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar61 = (bool)(bVar60 >> 1 & 1);
  bVar7 = (bool)(bVar60 >> 2 & 1);
  bVar8 = (bool)(bVar60 >> 3 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar61 * auVar81._4_4_ | (uint)!bVar61 * tray.tfar.field_0.i[1];
  tray.tfar.field_0.i[0] =
       (uint)(bVar60 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar60 & 1) * tray.tfar.field_0.i[0];
  tray.tfar.field_0.i[2] = (uint)bVar7 * auVar81._8_4_ | (uint)!bVar7 * tray.tfar.field_0.i[2];
  tray.tfar.field_0.i[3] = (uint)bVar8 * auVar81._12_4_ | (uint)!bVar8 * tray.tfar.field_0.i[3];
  goto LAB_01c99ae1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }